

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLHARAMICROSS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000278;
  double *in_stack_00000280;
  double *in_stack_00000288;
  double *in_stack_00000290;
  int in_stack_0000029c;
  int in_stack_000002a0;
  int *in_stack_000002b0;
  int *in_stack_000002b8;
  int *in_stack_000002c0;
  
  TVar1 = TA_CDLHARAMICROSS(in_stack_000002a0,in_stack_0000029c,in_stack_00000290,in_stack_00000288,
                            in_stack_00000280,in_stack_00000278,in_stack_000002b0,in_stack_000002b8,
                            in_stack_000002c0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLHARAMICROSS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLHARAMICROSS(
/* Generated */                        startIdx,
/* Generated */                        endIdx,
/* Generated */                        params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                        params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                        params->in[0].data.inPrice.low, /* inLow */
/* Generated */                        params->in[0].data.inPrice.close, /* inClose */
/* Generated */                        outBegIdx, 
/* Generated */                        outNBElement, 
/* Generated */                        params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }